

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_reduction_Test::~expr_reduction_Test(expr_reduction_Test *this)

{
  expr_reduction_Test *this_local;
  
  ~expr_reduction_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, reduction) {  // NOLINT
    Context c;
    auto &mod = c.generator("mod");
    auto &a = mod.var("a", 2);
    auto &b = a.r_or();
    EXPECT_EQ(b.width(), 1);
    EXPECT_EQ(b.to_string(), "|a");
}